

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_script.cpp
# Opt level: O3

void __thiscall DFraggleThinker::AddRunningScript(DFraggleThinker *this,DRunningScript *runscr)

{
  DRunningScript *pDVar1;
  DObject *pDVar2;
  
  (runscr->next).field_0 = (((this->RunningScripts).field_0.p)->next).field_0;
  pDVar1 = (this->RunningScripts).field_0.p;
  if (pDVar1 == (DRunningScript *)0x0) {
LAB_005111db:
    pDVar1 = (DRunningScript *)0x0;
  }
  else if (((pDVar1->super_DObject).ObjectFlags & 0x20) != 0) {
    (this->RunningScripts).field_0.p = (DRunningScript *)0x0;
    goto LAB_005111db;
  }
  pDVar2 = (pDVar1->next).field_0.o;
  if (pDVar2 != (DObject *)0x0) {
    if ((pDVar2->ObjectFlags & 0x20) == 0) {
      if (((pDVar2->ObjectFlags & 3) != 0) && (((runscr->super_DObject).ObjectFlags & 4) != 0)) {
        GC::Barrier(&runscr->super_DObject,pDVar2);
      }
    }
    else {
      (pDVar1->next).field_0.p = (DRunningScript *)0x0;
    }
  }
  pDVar2 = (this->RunningScripts).field_0.o;
  (runscr->prev).field_0.o = pDVar2;
  if ((pDVar2->ObjectFlags & 0x20) == 0) {
    if (((pDVar2->ObjectFlags & 3) != 0) && (((runscr->super_DObject).ObjectFlags & 4) != 0)) {
      GC::Barrier(&runscr->super_DObject,pDVar2);
    }
  }
  else {
    (this->RunningScripts).field_0.p = (DRunningScript *)0x0;
  }
  (((runscr->prev).field_0.p)->next).field_0.p = runscr;
  pDVar2 = (runscr->prev).field_0.o;
  if (pDVar2 == (DObject *)0x0) {
LAB_0051126a:
    pDVar2 = (DObject *)0x0;
  }
  else if ((pDVar2->ObjectFlags & 0x20) != 0) {
    (runscr->prev).field_0.p = (DRunningScript *)0x0;
    goto LAB_0051126a;
  }
  if ((((runscr->super_DObject).ObjectFlags & 3) != 0) && ((pDVar2->ObjectFlags & 4) != 0)) {
    GC::Barrier(pDVar2,&runscr->super_DObject);
  }
  pDVar1 = (runscr->next).field_0.p;
  if (pDVar1 == (DRunningScript *)0x0) {
    return;
  }
  if (((pDVar1->super_DObject).ObjectFlags & 0x20) != 0) {
    (runscr->next).field_0.p = (DRunningScript *)0x0;
    return;
  }
  (pDVar1->prev).field_0.p = runscr;
  pDVar2 = (runscr->next).field_0.o;
  if (pDVar2 != (DObject *)0x0) {
    if ((pDVar2->ObjectFlags & 0x20) == 0) goto LAB_005112b8;
    (runscr->next).field_0.p = (DRunningScript *)0x0;
  }
  pDVar2 = (DObject *)0x0;
LAB_005112b8:
  if ((((runscr->super_DObject).ObjectFlags & 3) != 0) && ((pDVar2->ObjectFlags & 4) != 0)) {
    GC::Barrier(pDVar2,&runscr->super_DObject);
    return;
  }
  return;
}

Assistant:

void DFraggleThinker::AddRunningScript(DRunningScript *runscr)
{
	runscr->next = RunningScripts->next;
	GC::WriteBarrier(runscr, RunningScripts->next);

	runscr->prev = RunningScripts;
	GC::WriteBarrier(runscr, RunningScripts);

	runscr->prev->next = runscr;
	GC::WriteBarrier(runscr->prev, runscr);

	if(runscr->next)
	{
		runscr->next->prev = runscr;
		GC::WriteBarrier(runscr->next, runscr);
	}
}